

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemSubroutine.cpp
# Opt level: O1

bool __thiscall
slang::ast::SystemSubroutine::checkArgCount
          (SystemSubroutine *this,ASTContext *context,bool isMethod,Args *args,SourceRange callRange
          ,size_t min,size_t max)

{
  size_t sVar1;
  pointer ppEVar2;
  bool bVar3;
  Diagnostic *pDVar4;
  SourceLocation SVar5;
  undefined7 in_register_00000011;
  long lVar7;
  DiagCode code;
  ulong uVar8;
  Args *__range2;
  bool bVar9;
  SourceRange sourceRange;
  size_t local_58;
  undefined4 local_4c;
  ASTContext *local_48;
  SourceLocation local_40;
  SourceLocation local_38;
  SourceLocation SVar6;
  
  local_38 = callRange.endLoc;
  local_40 = callRange.startLoc;
  local_4c = (undefined4)CONCAT71(in_register_00000011,isMethod);
  sVar1 = (args->_M_extent)._M_extent_value;
  bVar9 = sVar1 == 0;
  local_48 = context;
  if (!bVar9) {
    ppEVar2 = args->_M_ptr;
    bVar3 = Expression::bad(*ppEVar2);
    if (!bVar3) {
      lVar7 = 8;
      do {
        bVar9 = sVar1 << 3 == lVar7;
        if (bVar9) goto LAB_0046722f;
        bVar3 = Expression::bad(*(Expression **)((long)ppEVar2 + lVar7));
        lVar7 = lVar7 + 8;
      } while (!bVar3);
    }
    if (!bVar9) {
      return false;
    }
  }
LAB_0046722f:
  uVar8 = (args->_M_extent)._M_extent_value - (ulong)(byte)local_4c;
  if (uVar8 < min) {
    code.subsystem = Expressions;
    code.code = 0x9f;
    SVar5 = local_38;
    SVar6 = local_40;
  }
  else {
    if (uVar8 <= max) {
      return true;
    }
    SVar6 = (args->_M_ptr[max]->sourceRange).startLoc;
    SVar5 = (args->_M_ptr[max]->sourceRange).endLoc;
    code.subsystem = Expressions;
    code.code = 0xa0;
    min = max;
  }
  sourceRange.endLoc = SVar5;
  sourceRange.startLoc = SVar6;
  pDVar4 = ASTContext::addDiag(local_48,code,sourceRange);
  pDVar4 = Diagnostic::operator<<(pDVar4,&this->name);
  local_58 = min;
  std::
  vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
  ::emplace_back<unsigned_long>(&pDVar4->args,&local_58);
  local_58 = uVar8;
  std::
  vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
  ::emplace_back<unsigned_long>(&pDVar4->args,&local_58);
  return false;
}

Assistant:

bool SystemSubroutine::checkArgCount(const ASTContext& context, bool isMethod, const Args& args,
                                     SourceRange callRange, size_t min, size_t max) const {
    for (auto arg : args) {
        if (arg->bad())
            return false;
    }

    size_t provided = args.size();
    if (isMethod) {
        SLANG_ASSERT(provided);
        provided--;
    }

    if (provided < min) {
        context.addDiag(diag::TooFewArguments, callRange) << name << min << provided;
        return false;
    }

    if (provided > max) {
        context.addDiag(diag::TooManyArguments, args[max]->sourceRange) << name << max << provided;
        return false;
    }

    return true;
}